

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::renderBuffers(SceneRender *this,Uniforms *_uniforms)

{
  Camera *_camera;
  long *plVar1;
  Model *pMVar2;
  vector<vera::Fbo*,std::allocator<vera::Fbo*>> *pvVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Shader *pSVar8;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar9;
  vec<3,_float,_(glm::qualifier)0> *v2;
  _Base_ptr p_Var10;
  pointer ppFVar11;
  Fbo *pFVar12;
  pointer ppFVar13;
  size_t i;
  ulong uVar14;
  allocator local_141;
  Tracker *local_140;
  ulong local_138;
  vector<vera::Fbo*,std::allocator<vera::Fbo*>> *local_130;
  SceneRender *local_128;
  mat4 *local_120;
  mat4 *local_118;
  Model *local_110;
  vec<3,_float,_(glm::qualifier)0> *local_108;
  string bufferName;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  string local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_130 = (vector<vera::Fbo*,std::allocator<vera::Fbo*>> *)&this->buffersFbo;
  ppFVar11 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar13 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_128 = this;
  if (this->m_buffers_total != (long)ppFVar13 - (long)ppFVar11 >> 3) {
    for (uVar14 = 0; uVar14 < (ulong)((long)ppFVar13 - (long)ppFVar11 >> 3); uVar14 = uVar14 + 1) {
      if (ppFVar11[uVar14] != (Fbo *)0x0) {
        (*ppFVar11[uVar14]->_vptr_Fbo[1])();
        ppFVar11 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppFVar13 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (ppFVar13 != ppFVar11) {
      (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppFVar11;
    }
    for (uVar14 = 0; uVar14 < this->m_buffers_total; uVar14 = uVar14 + 1) {
      pFVar12 = (Fbo *)operator_new(0x38);
      vera::Fbo::Fbo(pFVar12);
      pvVar3 = local_130;
      local_90[0]._M_dataplus._M_p = (pointer)pFVar12;
      std::vector<vera::Fbo*,std::allocator<vera::Fbo*>>::emplace_back<vera::Fbo*>
                (local_130,(Fbo **)local_90);
      plVar1 = *(long **)(*(long *)pvVar3 + uVar14 * 8);
      iVar6 = vera::getWindowWidth();
      iVar7 = vera::getWindowHeight();
      (**(code **)(*plVar1 + 0x10))(plVar1,iVar6,iVar7,4,0,0,1);
      this = local_128;
    }
  }
  local_120 = &(this->m_origin).m_transformMatrix;
  local_110 = &this->m_floor;
  local_140 = &_uniforms->tracker;
  local_118 = &(this->m_floor).super_Node.m_transformMatrix;
  local_108 = &(this->m_origin).m_position;
  pMVar2 = &this->m_floor;
  local_138 = 0;
  while( true ) {
    ppFVar11 = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->buffersFbo).
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3) <= local_138) break;
    pFVar12 = ppFVar11[local_138];
    if (pFVar12->m_allocated == false) {
      uVar4 = vera::getWindowWidth();
      uVar5 = vera::getWindowHeight();
      this = local_128;
      (*pFVar12->_vptr_Fbo[2])(pFVar12,(ulong)uVar4,(ulong)uVar5,4,0,0,1);
      pFVar12 = *(Fbo **)(*(long *)local_130 + local_138 * 8);
    }
    (*pFVar12->_vptr_Fbo[3])(pFVar12);
    vera::toString<unsigned_long>(local_90,&local_138);
    std::operator+(&bufferName,"u_sceneBuffer",local_90);
    std::__cxx11::string::~string((string *)local_90);
    if (this->m_depth_test == true) {
      glEnable(0xb71);
    }
    _camera = (_uniforms->super_Scene).activeCamera;
    if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
      vera::setCamera(_camera);
      vera::applyMatrix(local_120);
    }
    if (-1 < this->m_floor_subd_target) {
      pSVar8 = vera::Model::getBufferShader(local_110,&bufferName);
      if (pSVar8 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,"render:",&bufferName);
          std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_d0,":floor");
          Tracker::begin(local_140,local_90);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        vera::Shader::use(pSVar8);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar8,0);
        std::__cxx11::string::string((string *)&local_50,"u_modelViewProjectionMatrix",&local_141);
        vera::getProjectionViewWorldMatrix();
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_90,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&local_d0,local_118);
        vera::Shader::setUniform(pSVar8,&local_50,(mat4 *)local_90,false);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)local_90,"u_model",(allocator *)&local_50);
        local_d0 = glm::operator+(local_108,&(pMVar2->super_Node).m_position);
        vera::Shader::setUniform(pSVar8,local_90,(vec3 *)&local_d0);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::string((string *)&local_d0,"u_modelMatrix",(allocator *)&local_50);
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_90,local_120,local_118);
        vera::Shader::setUniform
                  (pSVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_d0,(mat4 *)local_90,false);
        std::__cxx11::string::~string((string *)&local_d0);
        vera::Model::render(local_110,pSVar8);
        if ((_uniforms->tracker).m_running == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,"render:",&bufferName);
          std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_d0,":floor");
          Tracker::end(local_140,local_90);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_d0);
        }
      }
    }
    vera::cullingMode(this->m_culling);
    for (p_Var10 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left; this = local_128,
        (_Rb_tree_header *)p_Var10 !=
        &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      pSVar8 = vera::Model::getBufferShader(*(Model **)(p_Var10 + 2),&bufferName);
      if (pSVar8 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          std::operator+(&local_50,"render:",&bufferName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,&local_50,":");
          std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(p_Var10 + 2) + 0x2b0));
          Tracker::begin(local_140,local_90);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
        }
        vera::Shader::use(pSVar8);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar8,0);
        std::__cxx11::string::string((string *)&local_50,"u_modelViewProjectionMatrix",&local_141);
        vera::getProjectionViewWorldMatrix();
        pmVar9 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                 (**(code **)(**(long **)(p_Var10 + 2) + 0x100))();
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_90,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&local_d0,pmVar9);
        vera::Shader::setUniform(pSVar8,&local_50,(mat4 *)local_90,false);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)local_90,"u_model",(allocator *)&local_50);
        v2 = (vec<3,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(p_Var10 + 2) + 0x98))();
        local_d0 = glm::operator+(local_108,v2);
        vera::Shader::setUniform(pSVar8,local_90,(vec3 *)&local_d0);
        std::__cxx11::string::~string((string *)local_90);
        std::__cxx11::string::string((string *)&local_d0,"u_modelMatrix",(allocator *)&local_50);
        pmVar9 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                 (**(code **)(**(long **)(p_Var10 + 2) + 0x100))();
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)local_90,local_120,pmVar9);
        vera::Shader::setUniform
                  (pSVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_d0,(mat4 *)local_90,false);
        std::__cxx11::string::~string((string *)&local_d0);
        vera::Model::render(*(Model **)(p_Var10 + 2),pSVar8);
        if ((_uniforms->tracker).m_running == true) {
          std::operator+(&local_50,"render:",&bufferName);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,&local_50,":");
          std::operator+(local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(p_Var10 + 2) + 0x2b0));
          Tracker::end(local_140,local_90);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
    }
    if (local_128->m_depth_test != false) {
      glDisable(0xb71);
    }
    if (this->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    (**(code **)(**(long **)(*(long *)local_130 + local_138 * 8) + 0x20))();
    std::__cxx11::string::~string((string *)&bufferName);
    local_138 = local_138 + 1;
  }
  return;
}

Assistant:

void SceneRender::renderBuffers(Uniforms& _uniforms) {
    if ( m_buffers_total != buffersFbo.size() ) {
        for (size_t i = 0; i < buffersFbo.size(); i++)
            delete buffersFbo[i];
        buffersFbo.clear();
        
        for (size_t i = 0; i < m_buffers_total; i++) {
            buffersFbo.push_back( new vera::Fbo() );

            // glm::vec2 size = glm::vec2(vera::getWindowWidth(), vera::getWindowHeight());
            // buffersFbo[i].fixed = getBufferSize(_fragmentShader, "u_sceneBuffer" + vera::toString(i), size);
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
        }
    }

    vera::Shader* bufferShader = nullptr;
    for (size_t i = 0; i < buffersFbo.size(); i++) {
        if (!buffersFbo[i]->isAllocated())
            buffersFbo[i]->allocate(vera::getWindowWidth(), vera::getWindowHeight(), vera::GBUFFER_TEXTURE);
            // continue;;

        buffersFbo[i]->bind();
        std::string bufferName = "u_sceneBuffer" + vera::toString(i);

        // Begining of DEPTH for 3D 
        if (m_depth_test)
            glEnable(GL_DEPTH_TEST);

        if (_uniforms.activeCamera->bChange || m_origin.bChange) {
            vera::setCamera( _uniforms.activeCamera );
            vera::applyMatrix( m_origin.getTransformMatrix() );
        }

        if (m_floor_subd_target >= 0) {
            bufferShader = m_floor.getBufferShader(bufferName);
            if (bufferShader != nullptr) {
                    TRACK_BEGIN("render:"+bufferName+":floor")
                    bufferShader->use();
                    _uniforms.feedTo( bufferShader, false );
                    bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix() );
                    bufferShader->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );
                    bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
                    m_floor.render(bufferShader);
                    TRACK_END("render:"+bufferName+":floor")
                }
        }

        vera::cullingMode(m_culling);

        for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
            bufferShader = it->second->getBufferShader(bufferName);

            if (bufferShader != nullptr) {
                TRACK_BEGIN("render:" + bufferName + ":" + it->second->getName())

                // bind the shader
                bufferShader->use();

                // Update Uniforms and textures variables to the shader
                _uniforms.feedTo( bufferShader, false );

                // Pass special uniforms
                bufferShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
                bufferShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
                bufferShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
                it->second->render(bufferShader);

                TRACK_END("render:" + bufferName + ":" + it->second->getName())
            }
        }

        if (m_depth_test)
            glDisable(GL_DEPTH_TEST);

        if (m_culling != 0)
            glDisable(GL_CULL_FACE);

        buffersFbo[i]->unbind();
    }
}